

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (buffer_appender<char> out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  significand_type sVar1;
  size_t size;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  buffer_appender<char> bVar6;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char cVar12;
  buffer<char> *buf;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_85 [5];
  sign_t local_80;
  int local_7c;
  uint local_78;
  undefined1 local_74 [4];
  anon_class_56_7_a2a26a24 local_70;
  decimal_fp<float> local_38;
  
  local_78 = fp->significand;
  uVar10 = 0x1f;
  if ((local_78 | 1) != 0) {
    for (; (local_78 | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  local_7c = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2) -
             (uint)(local_78 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2) * 4));
  uVar10 = fspecs._4_4_;
  local_80 = uVar10 >> 8 & 0xff;
  local_85[0] = decimal_point;
  local_38 = (decimal_fp<float>)fspecs;
  if (local_7c < 0) goto LAB_003bccc4;
  uVar9 = (local_7c + 1) - (uint)(local_80 == none);
  uVar11 = (ulong)uVar9;
  iVar4 = fp->exponent;
  sVar1 = iVar4 + local_7c;
  uVar7 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_003bc984:
    iVar4 = iVar4 + local_7c + -1;
    cVar12 = decimal_point;
    if ((uVar10 >> 0x14 & 1) == 0) {
      iVar14 = 0;
      if (local_7c == 1) {
        cVar12 = '\0';
      }
    }
    else {
      iVar14 = 0;
      if (0 < (int)(uVar7 - local_7c)) {
        iVar14 = uVar7 - local_7c;
      }
      uVar11 = (ulong)(uVar9 + iVar14);
    }
    iVar3 = 1 - sVar1;
    if (0 < (int)sVar1) {
      iVar3 = iVar4;
    }
    lVar8 = 2;
    if (99 < iVar3) {
      lVar8 = (ulong)(999 < iVar3) + 3;
    }
    uVar5 = (3 - (ulong)(cVar12 == '\0')) + uVar11 + lVar8;
    local_70.sign = (sign_t *)(CONCAT44(local_78,uVar10 >> 8) & 0xffffffff000000ff);
    local_70.significand._0_5_ = CONCAT14(cVar12,local_7c);
    local_70.significand_size =
         (int *)(CONCAT35(local_70.significand_size._5_3_,
                          CONCAT14(((uVar10 >> 0x10 & 1) == 0) << 5,iVar14)) | 0x4500000000);
    local_70.fp = (decimal_fp<float> *)CONCAT44(local_70.fp._4_4_,iVar4);
    uVar11 = (ulong)specs->width;
    if ((long)uVar11 < 1) {
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10)) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      bVar6 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()
                        ((anon_class_28_7_94dcc806 *)&local_70,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar15 = 0;
    if (uVar5 <= uVar11) {
      uVar15 = uVar11 - uVar5;
    }
    bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + (specs->fill).size_ * uVar15) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar11 = uVar15 >> (bVar2 & 0x3f);
    bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                   ::anon_class_28_7_94dcc806::operator()
                             ((anon_class_28_7_94dcc806 *)&local_70,
                              bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    goto LAB_003bcbd0;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar13 = 0x10;
    if (0 < (int)uVar7) {
      uVar13 = uVar7;
    }
    if (((int)sVar1 < -3) || ((int)uVar13 < (int)sVar1)) goto LAB_003bc984;
  }
  local_74 = (undefined1  [4])sVar1;
  if (iVar4 < 0) {
    if (0 < (int)sVar1) {
      local_85._1_4_ = uVar7 - local_7c & (int)(uVar10 << 0xb) >> 0x1f;
      local_70.decimal_point = local_85 + 1;
      uVar10 = local_85._1_4_;
      if ((int)local_85._1_4_ < 1) {
        uVar10 = 0;
      }
      size = (ulong)uVar10 + 1 + uVar11;
      local_70.sign = &local_80;
      local_70.significand = &local_78;
      local_70.significand_size = &local_7c;
      local_70.fp = (decimal_fp<float> *)local_74;
      local_70.fspecs = (float_specs *)local_85;
      bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_&>
                        (out,specs,size,size,(anon_class_48_6_48d028d1 *)&local_70);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar10 = -sVar1;
    local_85._1_4_ = uVar10;
    if (SBORROW4(uVar7,uVar10) != (int)(uVar7 + sVar1) < 0) {
      local_85._1_4_ = uVar7;
    }
    if ((int)uVar7 < 0) {
      local_85._1_4_ = uVar10;
    }
    if (local_7c != 0) {
      local_85._1_4_ = uVar10;
    }
    if (-1 < (int)local_85._1_4_) {
      local_70.sign = &local_80;
      local_70.significand = (significand_type *)(local_85 + 1);
      local_70.significand_size = &local_7c;
      local_70.fp = &local_38;
      local_70.fspecs = (float_specs *)local_85;
      local_70.decimal_point = (char *)&local_78;
      uVar5 = (ulong)specs->width;
      if (-1 < (long)uVar5) {
        uVar11 = (uint)local_85._1_4_ + uVar11 + 2;
        uVar15 = 0;
        if (uVar11 <= uVar5) {
          uVar15 = uVar5 - uVar11;
        }
        bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar11 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                     container + 0x10) + (specs->fill).size_ * uVar15) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar11 = uVar15 >> (bVar2 & 0x3f);
        bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                       ::anon_class_48_6_9afe1116::operator()
                                 ((anon_class_48_6_9afe1116 *)&local_70,
                                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_003bcbd0;
      }
    }
    goto LAB_003bccc4;
  }
  uVar11 = (ulong)(iVar4 + uVar9);
  local_85._1_4_ = uVar7 - sVar1;
  if ((uVar10 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_85._1_4_)) {
      if ((int)local_85._1_4_ < 1) goto LAB_003bcb21;
    }
    else {
      local_85._1_4_ = 1;
    }
    uVar11 = uVar11 + (uint)local_85._1_4_;
  }
LAB_003bcb21:
  local_70.sign = &local_80;
  local_70.significand = &local_78;
  local_70.significand_size = &local_7c;
  local_70.fspecs = (float_specs *)&local_38;
  local_70.decimal_point = local_85;
  local_70.num_zeros = (int *)(local_85 + 1);
  uVar5 = (ulong)specs->width;
  local_70.fp = fp;
  if ((long)uVar5 < 0) {
LAB_003bccc4:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar15 = 0;
  if (uVar11 <= uVar5) {
    uVar15 = uVar5 - uVar11;
  }
  bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar11 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x10) + (specs->fill).size_ * uVar15) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar11 = uVar15 >> (bVar2 & 0x3f);
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                 ::anon_class_56_7_a2a26a24::operator()
                           (&local_70,
                            bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_003bcbd0:
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar15 - uVar11,&specs->fill);
  return (buffer_appender<char>)
         bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}